

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fixups.cpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::external_fixup::key(external_fixup *this,string *k)

{
  bool bVar1;
  uint64_t *args;
  error_code eVar2;
  
  bVar1 = std::operator==(k,"name");
  if (bVar1) {
    *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
         (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 1;
    args = &this->name_;
  }
  else {
    bVar1 = std::operator==(k,"type");
    if (bVar1) {
      *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
           (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 2;
      args = &this->type_;
    }
    else {
      bVar1 = std::operator==(k,"is_weak");
      if (bVar1) {
        *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
             (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 4;
        eVar2 = rule::push<pstore::exchange::import_ns::bool_rule,bool*>
                          (&this->super_rule,&this->is_weak_);
        return eVar2;
      }
      bVar1 = std::operator==(k,"offset");
      if (!bVar1) {
        bVar1 = std::operator==(k,"addend");
        if (bVar1) {
          *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
               (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 0x10;
          eVar2 = rule::push<pstore::exchange::import_ns::int64_rule,long*>
                            (&this->super_rule,&this->addend_);
          return eVar2;
        }
        eVar2 = make_error_code(unrecognized_xfixup_key);
        return eVar2;
      }
      *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
           (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 8;
      args = &this->offset_;
    }
  }
  eVar2 = rule::push<pstore::exchange::import_ns::uint64_rule,unsigned_long*>
                    (&this->super_rule,args);
  return eVar2;
}

Assistant:

std::error_code external_fixup::key (std::string const & k) {
                if (k == "name") {
                    seen_[name_index] = true;
                    return this->push<uint64_rule> (&name_);
                }
                if (k == "type") {
                    seen_[type] = true;
                    return this->push<uint64_rule> (&type_);
                }
                if (k == "is_weak") {
                    seen_[is_weak] = true;
                    return this->push<bool_rule> (&is_weak_);
                }
                if (k == "offset") {
                    seen_[offset] = true;
                    return this->push<uint64_rule> (&offset_);
                }
                if (k == "addend") {
                    seen_[addend] = true;
                    return this->push<int64_rule> (&addend_);
                }
                return error::unrecognized_xfixup_key;
            }